

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcRelDefines::~IfcRelDefines(IfcRelDefines *this)

{
  ~IfcRelDefines((IfcRelDefines *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)));
  return;
}

Assistant:

IfcRelDefines() : Object("IfcRelDefines") {}